

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O1

void Abc_TruthRpoTest(char *pFileName,int nVarNum,int nThreshold,int fVerbose)

{
  byte bVar1;
  uint uVar2;
  word *pwVar3;
  word **ppwVar4;
  char *__ptr;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  char cVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  Rpo_TtStore_t *unaff_R15;
  bool bVar16;
  int nTruths;
  int nVars;
  uint local_38;
  uint local_34;
  
  if (nVarNum < 0) {
    unaff_R15 = (Rpo_TtStore_t *)&local_38;
    Abc_TruthGetParams(pFileName,(int *)&local_34,(int *)unaff_R15);
    bVar16 = local_34 - 2 < 0xf;
    if (local_38 != 0 && bVar16) {
      lVar15 = (long)(int)local_38;
      unaff_R15 = (Rpo_TtStore_t *)malloc(0x18);
      bVar5 = (char)local_34 - 6;
      uVar2 = 1 << (bVar5 & 0x1f);
      if ((int)local_34 < 7) {
        uVar2 = 1;
      }
      unaff_R15->nVars = local_34;
      unaff_R15->nWords = uVar2;
      unaff_R15->nFuncs = local_38;
      bVar1 = bVar5;
      if ((int)local_34 < 7) {
        bVar1 = 0;
      }
      ppwVar4 = (word **)malloc(((ulong)uVar2 * 8 + 8) * lVar15);
      unaff_R15->pFuncs = ppwVar4;
      *ppwVar4 = (word *)(ppwVar4 + lVar15);
      memset(ppwVar4 + lVar15,0,lVar15 << (bVar1 + 3 & 0x3f));
      if (1 < (int)local_38) {
        pwVar3 = *ppwVar4;
        uVar6 = 1;
        do {
          pwVar3 = pwVar3 + uVar2;
          ppwVar4[uVar6] = pwVar3;
          uVar6 = uVar6 + 1;
        } while (local_38 != uVar6);
      }
      __ptr = Abc_FileRead(pFileName);
      if (__ptr != (char *)0x0) {
        cVar11 = *__ptr;
        lVar15 = 0;
        if (cVar11 != '\n') {
          uVar2 = 0x10 << (bVar5 & 0x1f);
          if ((int)local_34 < 7) {
            uVar2 = 0x10;
          }
          lVar15 = 0;
          lVar13 = 0;
          pcVar8 = __ptr;
          do {
            if (cVar11 == '0') {
              pcVar8 = pcVar8 + (ulong)(pcVar8[1] == 'x') * 2;
            }
            if ((0x20 < (ulong)(byte)pcVar8[(int)uVar2]) ||
               ((0x100002401U >> ((ulong)(byte)pcVar8[(int)uVar2] & 0x3f) & 1) == 0)) {
              __assert_fail("EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                            ,0x6d,"void Abc_TruthReadHex(word *, char *, int)");
            }
            if (0 < (int)uVar2) {
              pwVar3 = ppwVar4[lVar15];
              pcVar8 = pcVar8 + ((ulong)uVar2 - 1);
              lVar12 = 0;
              uVar6 = 0;
              do {
                cVar11 = *pcVar8;
                iVar7 = -0x30;
                if (9 < (byte)(cVar11 - 0x30U)) {
                  if ((byte)(cVar11 + 0xbfU) < 6) {
                    iVar7 = -0x37;
                  }
                  else {
                    iVar7 = -0x57;
                    if (5 < (byte)(cVar11 + 0x9fU)) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                                    ,0x51,"int Abc_TruthReadHexDigit(char)");
                    }
                  }
                }
                pwVar3[uVar6 >> 4 & 0xfffffff] =
                     pwVar3[uVar6 >> 4 & 0xfffffff] |
                     (ulong)(uint)(iVar7 + cVar11) << ((byte)lVar12 & 0x3c);
                uVar6 = uVar6 + 1;
                lVar12 = lVar12 + 4;
                pcVar8 = pcVar8 + -1;
              } while ((ulong)uVar2 * 4 - lVar12 != 0);
            }
            lVar15 = lVar15 + 1;
            lVar12 = lVar13 << 0x20;
            lVar13 = (long)(int)lVar13;
            do {
              pcVar8 = __ptr + lVar13;
              lVar13 = lVar13 + 1;
              lVar12 = lVar12 + 0x100000000;
            } while (*pcVar8 != '\n');
            pcVar8 = __ptr + (lVar12 >> 0x20);
            cVar11 = __ptr[lVar12 >> 0x20];
          } while (cVar11 != '\n');
        }
        if ((int)local_38 < (int)lVar15) {
          __assert_fail("p->nFuncs >= nLines",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                        ,0x101,"void Abc_TruthStoreRead(char *, Rpo_TtStore_t *)");
        }
        unaff_R15->nFuncs = (int)lVar15;
        free(__ptr);
      }
    }
    if (local_38 != 0 && bVar16) goto LAB_0029c970;
  }
  else {
    uVar2 = Abc_FileSize(pFileName);
    uVar10 = 1 << ((char)nVarNum - 3U & 0x1f);
    uVar6 = (long)(int)uVar2 / (long)(int)uVar10;
    uVar9 = (long)(int)uVar2 % (long)(int)uVar10;
    if (uVar2 != 0xffffffff) {
      if (nVarNum < 6) {
        __assert_fail("nVarNum >= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                      ,0x141,"Rpo_TtStore_t *Abc_TtStoreLoad(char *, int)");
      }
      if ((int)uVar9 != 0) {
        Abc_Print(0,
                  "The file size (%d) is divided by the truth table size (%d) with remainder (%d).\n"
                  ,(ulong)uVar2,(ulong)uVar10,uVar9 & 0xffffffff);
      }
      pwVar3 = (word *)Abc_FileRead(pFileName);
      unaff_R15 = (Rpo_TtStore_t *)malloc(0x18);
      unaff_R15->nVars = nVarNum;
      iVar7 = 1 << ((char)nVarNum - 6U & 0x1f);
      unaff_R15->nWords = iVar7;
      iVar14 = (int)uVar6;
      unaff_R15->nFuncs = iVar14;
      ppwVar4 = (word **)malloc((long)iVar14 << 3);
      unaff_R15->pFuncs = ppwVar4;
      *ppwVar4 = pwVar3;
      if (1 < iVar14) {
        pwVar3 = *ppwVar4;
        uVar9 = 1;
        do {
          pwVar3 = pwVar3 + iVar7;
          ppwVar4[uVar9] = pwVar3;
          uVar9 = uVar9 + 1;
        } while ((uVar6 & 0xffffffff) != uVar9);
      }
    }
    if (uVar2 != 0xffffffff) goto LAB_0029c970;
  }
  unaff_R15 = (Rpo_TtStore_t *)0x0;
LAB_0029c970:
  if (fVerbose != 0) {
    Abc_Print(-2,"Number of variables = %d\n",(ulong)(uint)unaff_R15->nVars);
  }
  Abc_TruthRpoPerform(unaff_R15,nThreshold,fVerbose);
  if ((-1 < nVarNum) && (*unaff_R15->pFuncs != (word *)0x0)) {
    free(*unaff_R15->pFuncs);
    *unaff_R15->pFuncs = (word *)0x0;
  }
  if (unaff_R15->pFuncs != (word **)0x0) {
    free(unaff_R15->pFuncs);
    unaff_R15->pFuncs = (word **)0x0;
  }
  if (unaff_R15 != (Rpo_TtStore_t *)0x0) {
    free(unaff_R15);
  }
  return;
}

Assistant:

void Abc_TruthRpoTest(char * pFileName, int nVarNum, int nThreshold, int fVerbose) {
    Rpo_TtStore_t * p;

    // allocate data-structure
//    if (fVerbose) {
//        Abc_Print(-2, "Number of variables = %d\n", nVarNum);
//    }
    p = Abc_TtStoreLoad(pFileName, nVarNum);

    if (fVerbose) {
        Abc_Print(-2, "Number of variables = %d\n", p->nVars);
    }
    // consider functions from the file
    Abc_TruthRpoPerform(p, nThreshold, fVerbose);

    // delete data-structure
    Abc_TtStoreFree(p, nVarNum);
    //    printf( "Finished decomposing truth tables from file \"%s\".\n", pFileName );
}